

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O0

void fadst16_avx2(__m256i *in,__m256i *out,int8_t bit,int num_cols,int outstride)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  uint uVar36;
  uint bit_00;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  int32_t *piVar41;
  undefined1 (*pauVar42) [32];
  undefined1 (*pauVar43) [32];
  undefined1 (*pauVar44) [32];
  undefined1 (*pauVar45) [32];
  undefined8 *puVar46;
  int in_ECX;
  char in_DL;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  undefined8 uVar63;
  undefined8 uVar64;
  undefined8 uVar65;
  undefined8 uVar66;
  undefined8 uVar67;
  undefined8 uVar68;
  undefined8 uVar69;
  undefined8 uVar70;
  undefined8 uVar71;
  undefined8 uVar72;
  undefined8 uVar73;
  undefined8 uVar74;
  undefined8 uVar75;
  undefined8 uVar76;
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  int col;
  __m256i y;
  __m256i x;
  __m256i v [16];
  __m256i u [16];
  __m256i zero;
  __m256i rnding;
  __m256i cospim58;
  __m256i cospi6;
  __m256i cospi58;
  __m256i cospim50;
  __m256i cospi14;
  __m256i cospi50;
  __m256i cospim42;
  __m256i cospi22;
  __m256i cospi42;
  __m256i cospim34;
  __m256i cospi30;
  __m256i cospi34;
  __m256i cospim26;
  __m256i cospi38;
  __m256i cospi26;
  __m256i cospim18;
  __m256i cospi46;
  __m256i cospi18;
  __m256i cospim10;
  __m256i cospi54;
  __m256i cospi10;
  __m256i cospim2;
  __m256i cospi62;
  __m256i cospi2;
  __m256i cospi40;
  __m256i cospim40;
  __m256i cospim24;
  __m256i cospi24;
  __m256i cospim8;
  __m256i cospim56;
  __m256i cospi56;
  __m256i cospi8;
  __m256i cospim48;
  __m256i cospim16;
  __m256i cospi16;
  __m256i cospi48;
  __m256i cospi32;
  int32_t *cospi;
  uint uVar77;
  uint uVar78;
  uint uVar79;
  uint uVar80;
  uint uVar81;
  uint uVar82;
  int local_29c4;
  undefined8 local_2980;
  undefined8 uStack_2978;
  undefined8 uStack_2970;
  undefined8 uStack_2968;
  undefined8 local_2960;
  undefined8 uStack_2958;
  undefined8 uStack_2950;
  undefined8 uStack_2948;
  undefined8 local_2940;
  undefined8 uStack_2938;
  undefined8 uStack_2930;
  undefined8 uStack_2928;
  undefined8 local_2920;
  undefined8 uStack_2918;
  undefined8 uStack_2910;
  undefined8 uStack_2908;
  undefined1 local_2900 [16];
  undefined8 uStack_28f0;
  undefined8 uStack_28e8;
  undefined1 local_28e0 [16];
  undefined8 uStack_28d0;
  undefined8 uStack_28c8;
  undefined1 local_28c0 [16];
  undefined8 uStack_28b0;
  undefined8 uStack_28a8;
  undefined1 local_28a0 [16];
  undefined8 uStack_2890;
  undefined8 uStack_2888;
  undefined1 local_2880 [16];
  undefined8 uStack_2870;
  undefined8 uStack_2868;
  undefined1 local_2860 [16];
  undefined8 uStack_2850;
  undefined8 uStack_2848;
  undefined1 local_2840 [16];
  undefined8 uStack_2830;
  undefined8 uStack_2828;
  undefined1 local_2820 [16];
  undefined8 uStack_2810;
  undefined8 uStack_2808;
  undefined1 local_2800 [16];
  undefined8 uStack_27f0;
  undefined8 uStack_27e8;
  undefined1 local_27e0 [16];
  undefined8 uStack_27d0;
  undefined8 uStack_27c8;
  undefined1 local_27c0 [16];
  undefined8 uStack_27b0;
  undefined8 uStack_27a8;
  undefined1 local_27a0 [16];
  undefined8 uStack_2790;
  undefined8 uStack_2788;
  undefined8 local_2720;
  undefined8 uStack_2718;
  undefined8 uStack_2710;
  undefined8 uStack_2708;
  undefined8 local_26a0;
  undefined8 uStack_2698;
  undefined8 uStack_2690;
  undefined8 uStack_2688;
  undefined8 local_2620;
  undefined8 uStack_2618;
  undefined8 uStack_2610;
  undefined8 uStack_2608;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 uStack_90;
  undefined8 uStack_88;
  ulong uStack_58;
  
  piVar41 = cospi_arr((int)in_DL);
  uVar36 = piVar41[0x20];
  auVar1 = vpinsrd_avx(ZEXT416(uVar36),uVar36,1);
  auVar1 = vpinsrd_avx(auVar1,uVar36,2);
  auVar1 = vpinsrd_avx(auVar1,uVar36,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar36),uVar36,1);
  auVar2 = vpinsrd_avx(auVar2,uVar36,2);
  auVar2 = vpinsrd_avx(auVar2,uVar36,3);
  uStack_9d0 = auVar2._0_8_;
  uStack_9c8 = auVar2._8_8_;
  uVar36 = piVar41[0x30];
  auVar2 = vpinsrd_avx(ZEXT416(uVar36),uVar36,1);
  auVar2 = vpinsrd_avx(auVar2,uVar36,2);
  vpinsrd_avx(auVar2,uVar36,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar36),uVar36,1);
  auVar2 = vpinsrd_avx(auVar2,uVar36,2);
  vpinsrd_avx(auVar2,uVar36,3);
  uVar36 = piVar41[0x10];
  auVar2 = vpinsrd_avx(ZEXT416(uVar36),uVar36,1);
  auVar2 = vpinsrd_avx(auVar2,uVar36,2);
  vpinsrd_avx(auVar2,uVar36,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar36),uVar36,1);
  auVar2 = vpinsrd_avx(auVar2,uVar36,2);
  vpinsrd_avx(auVar2,uVar36,3);
  uVar36 = -piVar41[0x10];
  auVar2 = vpinsrd_avx(ZEXT416(uVar36),uVar36,1);
  auVar2 = vpinsrd_avx(auVar2,uVar36,2);
  vpinsrd_avx(auVar2,uVar36,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar36),uVar36,1);
  auVar2 = vpinsrd_avx(auVar2,uVar36,2);
  vpinsrd_avx(auVar2,uVar36,3);
  uVar36 = -piVar41[0x30];
  auVar2 = vpinsrd_avx(ZEXT416(uVar36),uVar36,1);
  auVar2 = vpinsrd_avx(auVar2,uVar36,2);
  vpinsrd_avx(auVar2,uVar36,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar36),uVar36,1);
  auVar2 = vpinsrd_avx(auVar2,uVar36,2);
  vpinsrd_avx(auVar2,uVar36,3);
  uVar36 = piVar41[8];
  auVar2 = vpinsrd_avx(ZEXT416(uVar36),uVar36,1);
  auVar2 = vpinsrd_avx(auVar2,uVar36,2);
  vpinsrd_avx(auVar2,uVar36,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar36),uVar36,1);
  auVar2 = vpinsrd_avx(auVar2,uVar36,2);
  vpinsrd_avx(auVar2,uVar36,3);
  uVar36 = piVar41[0x38];
  auVar2 = vpinsrd_avx(ZEXT416(uVar36),uVar36,1);
  auVar2 = vpinsrd_avx(auVar2,uVar36,2);
  vpinsrd_avx(auVar2,uVar36,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar36),uVar36,1);
  auVar2 = vpinsrd_avx(auVar2,uVar36,2);
  vpinsrd_avx(auVar2,uVar36,3);
  uVar36 = -piVar41[0x38];
  auVar2 = vpinsrd_avx(ZEXT416(uVar36),uVar36,1);
  auVar2 = vpinsrd_avx(auVar2,uVar36,2);
  vpinsrd_avx(auVar2,uVar36,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar36),uVar36,1);
  auVar2 = vpinsrd_avx(auVar2,uVar36,2);
  vpinsrd_avx(auVar2,uVar36,3);
  uVar36 = -piVar41[8];
  auVar2 = vpinsrd_avx(ZEXT416(uVar36),uVar36,1);
  auVar2 = vpinsrd_avx(auVar2,uVar36,2);
  vpinsrd_avx(auVar2,uVar36,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar36),uVar36,1);
  auVar2 = vpinsrd_avx(auVar2,uVar36,2);
  vpinsrd_avx(auVar2,uVar36,3);
  uVar36 = piVar41[0x18];
  auVar2 = vpinsrd_avx(ZEXT416(uVar36),uVar36,1);
  auVar2 = vpinsrd_avx(auVar2,uVar36,2);
  vpinsrd_avx(auVar2,uVar36,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar36),uVar36,1);
  auVar2 = vpinsrd_avx(auVar2,uVar36,2);
  vpinsrd_avx(auVar2,uVar36,3);
  uVar36 = -piVar41[0x18];
  auVar2 = vpinsrd_avx(ZEXT416(uVar36),uVar36,1);
  auVar2 = vpinsrd_avx(auVar2,uVar36,2);
  vpinsrd_avx(auVar2,uVar36,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar36),uVar36,1);
  auVar2 = vpinsrd_avx(auVar2,uVar36,2);
  vpinsrd_avx(auVar2,uVar36,3);
  uVar36 = -piVar41[0x28];
  auVar2 = vpinsrd_avx(ZEXT416(uVar36),uVar36,1);
  auVar2 = vpinsrd_avx(auVar2,uVar36,2);
  vpinsrd_avx(auVar2,uVar36,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar36),uVar36,1);
  auVar2 = vpinsrd_avx(auVar2,uVar36,2);
  vpinsrd_avx(auVar2,uVar36,3);
  uVar36 = piVar41[0x28];
  auVar2 = vpinsrd_avx(ZEXT416(uVar36),uVar36,1);
  auVar2 = vpinsrd_avx(auVar2,uVar36,2);
  vpinsrd_avx(auVar2,uVar36,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar36),uVar36,1);
  auVar2 = vpinsrd_avx(auVar2,uVar36,2);
  vpinsrd_avx(auVar2,uVar36,3);
  uVar36 = piVar41[2];
  auVar2 = vpinsrd_avx(ZEXT416(uVar36),uVar36,1);
  auVar2 = vpinsrd_avx(auVar2,uVar36,2);
  vpinsrd_avx(auVar2,uVar36,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar36),uVar36,1);
  auVar2 = vpinsrd_avx(auVar2,uVar36,2);
  vpinsrd_avx(auVar2,uVar36,3);
  uVar36 = piVar41[0x3e];
  auVar2 = vpinsrd_avx(ZEXT416(uVar36),uVar36,1);
  auVar2 = vpinsrd_avx(auVar2,uVar36,2);
  vpinsrd_avx(auVar2,uVar36,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar36),uVar36,1);
  auVar2 = vpinsrd_avx(auVar2,uVar36,2);
  vpinsrd_avx(auVar2,uVar36,3);
  uVar36 = -piVar41[2];
  auVar2 = vpinsrd_avx(ZEXT416(uVar36),uVar36,1);
  auVar2 = vpinsrd_avx(auVar2,uVar36,2);
  vpinsrd_avx(auVar2,uVar36,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar36),uVar36,1);
  auVar2 = vpinsrd_avx(auVar2,uVar36,2);
  vpinsrd_avx(auVar2,uVar36,3);
  uVar36 = piVar41[10];
  auVar2 = vpinsrd_avx(ZEXT416(uVar36),uVar36,1);
  auVar2 = vpinsrd_avx(auVar2,uVar36,2);
  vpinsrd_avx(auVar2,uVar36,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar36),uVar36,1);
  auVar2 = vpinsrd_avx(auVar2,uVar36,2);
  vpinsrd_avx(auVar2,uVar36,3);
  uVar36 = piVar41[0x36];
  auVar2 = vpinsrd_avx(ZEXT416(uVar36),uVar36,1);
  auVar2 = vpinsrd_avx(auVar2,uVar36,2);
  vpinsrd_avx(auVar2,uVar36,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar36),uVar36,1);
  auVar2 = vpinsrd_avx(auVar2,uVar36,2);
  vpinsrd_avx(auVar2,uVar36,3);
  bit_00 = -piVar41[10];
  auVar2 = vpinsrd_avx(ZEXT416(bit_00),bit_00,1);
  auVar2 = vpinsrd_avx(auVar2,bit_00,2);
  vpinsrd_avx(auVar2,bit_00,3);
  auVar2 = vpinsrd_avx(ZEXT416(bit_00),bit_00,1);
  auVar2 = vpinsrd_avx(auVar2,bit_00,2);
  vpinsrd_avx(auVar2,bit_00,3);
  uVar36 = piVar41[0x12];
  auVar2 = vpinsrd_avx(ZEXT416(uVar36),uVar36,1);
  auVar2 = vpinsrd_avx(auVar2,uVar36,2);
  vpinsrd_avx(auVar2,uVar36,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar36),uVar36,1);
  auVar2 = vpinsrd_avx(auVar2,uVar36,2);
  vpinsrd_avx(auVar2,uVar36,3);
  uVar77 = piVar41[0x2e];
  auVar2 = vpinsrd_avx(ZEXT416(uVar77),uVar77,1);
  auVar2 = vpinsrd_avx(auVar2,uVar77,2);
  vpinsrd_avx(auVar2,uVar77,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar77),uVar77,1);
  auVar2 = vpinsrd_avx(auVar2,uVar77,2);
  vpinsrd_avx(auVar2,uVar77,3);
  uVar37 = -piVar41[0x12];
  auVar2 = vpinsrd_avx(ZEXT416(uVar37),uVar37,1);
  auVar2 = vpinsrd_avx(auVar2,uVar37,2);
  vpinsrd_avx(auVar2,uVar37,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar37),uVar37,1);
  auVar2 = vpinsrd_avx(auVar2,uVar37,2);
  vpinsrd_avx(auVar2,uVar37,3);
  uVar78 = piVar41[0x1a];
  auVar2 = vpinsrd_avx(ZEXT416(uVar78),uVar78,1);
  auVar2 = vpinsrd_avx(auVar2,uVar78,2);
  vpinsrd_avx(auVar2,uVar78,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar78),uVar78,1);
  auVar2 = vpinsrd_avx(auVar2,uVar78,2);
  vpinsrd_avx(auVar2,uVar78,3);
  uVar79 = piVar41[0x26];
  auVar2 = vpinsrd_avx(ZEXT416(uVar79),uVar79,1);
  auVar2 = vpinsrd_avx(auVar2,uVar79,2);
  vpinsrd_avx(auVar2,uVar79,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar79),uVar79,1);
  auVar2 = vpinsrd_avx(auVar2,uVar79,2);
  vpinsrd_avx(auVar2,uVar79,3);
  uVar38 = -piVar41[0x1a];
  auVar2 = vpinsrd_avx(ZEXT416(uVar38),uVar38,1);
  auVar2 = vpinsrd_avx(auVar2,uVar38,2);
  vpinsrd_avx(auVar2,uVar38,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar38),uVar38,1);
  auVar2 = vpinsrd_avx(auVar2,uVar38,2);
  vpinsrd_avx(auVar2,uVar38,3);
  uVar80 = piVar41[0x22];
  auVar2 = vpinsrd_avx(ZEXT416(uVar80),uVar80,1);
  auVar2 = vpinsrd_avx(auVar2,uVar80,2);
  vpinsrd_avx(auVar2,uVar80,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar80),uVar80,1);
  auVar2 = vpinsrd_avx(auVar2,uVar80,2);
  vpinsrd_avx(auVar2,uVar80,3);
  uVar81 = piVar41[0x1e];
  auVar2 = vpinsrd_avx(ZEXT416(uVar81),uVar81,1);
  auVar2 = vpinsrd_avx(auVar2,uVar81,2);
  vpinsrd_avx(auVar2,uVar81,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar81),uVar81,1);
  auVar2 = vpinsrd_avx(auVar2,uVar81,2);
  vpinsrd_avx(auVar2,uVar81,3);
  uVar39 = -piVar41[0x22];
  auVar2 = vpinsrd_avx(ZEXT416(uVar39),uVar39,1);
  auVar2 = vpinsrd_avx(auVar2,uVar39,2);
  vpinsrd_avx(auVar2,uVar39,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar39),uVar39,1);
  auVar2 = vpinsrd_avx(auVar2,uVar39,2);
  vpinsrd_avx(auVar2,uVar39,3);
  uVar82 = piVar41[0x2a];
  auVar2 = vpinsrd_avx(ZEXT416(uVar82),uVar82,1);
  auVar2 = vpinsrd_avx(auVar2,uVar82,2);
  vpinsrd_avx(auVar2,uVar82,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar82),uVar82,1);
  auVar2 = vpinsrd_avx(auVar2,uVar82,2);
  vpinsrd_avx(auVar2,uVar82,3);
  uVar40 = piVar41[0x16];
  auVar2 = vpinsrd_avx(ZEXT416(uVar40),uVar40,1);
  auVar2 = vpinsrd_avx(auVar2,uVar40,2);
  vpinsrd_avx(auVar2,uVar40,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar40),uVar40,1);
  auVar2 = vpinsrd_avx(auVar2,uVar40,2);
  vpinsrd_avx(auVar2,uVar40,3);
  uVar40 = -piVar41[0x2a];
  auVar2 = vpinsrd_avx(ZEXT416(uVar40),uVar40,1);
  auVar2 = vpinsrd_avx(auVar2,uVar40,2);
  vpinsrd_avx(auVar2,uVar40,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar40),uVar40,1);
  auVar2 = vpinsrd_avx(auVar2,uVar40,2);
  vpinsrd_avx(auVar2,uVar40,3);
  uVar40 = piVar41[0x32];
  auVar2 = vpinsrd_avx(ZEXT416(uVar40),uVar40,1);
  auVar2 = vpinsrd_avx(auVar2,uVar40,2);
  vpinsrd_avx(auVar2,uVar40,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar40),uVar40,1);
  auVar2 = vpinsrd_avx(auVar2,uVar40,2);
  vpinsrd_avx(auVar2,uVar40,3);
  uVar40 = piVar41[0xe];
  auVar2 = vpinsrd_avx(ZEXT416(uVar40),uVar40,1);
  auVar2 = vpinsrd_avx(auVar2,uVar40,2);
  vpinsrd_avx(auVar2,uVar40,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar40),uVar40,1);
  auVar2 = vpinsrd_avx(auVar2,uVar40,2);
  vpinsrd_avx(auVar2,uVar40,3);
  uVar40 = -piVar41[0x32];
  auVar2 = vpinsrd_avx(ZEXT416(uVar40),uVar40,1);
  auVar2 = vpinsrd_avx(auVar2,uVar40,2);
  vpinsrd_avx(auVar2,uVar40,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar40),uVar40,1);
  auVar2 = vpinsrd_avx(auVar2,uVar40,2);
  vpinsrd_avx(auVar2,uVar40,3);
  uVar40 = piVar41[0x3a];
  auVar2 = vpinsrd_avx(ZEXT416(uVar40),uVar40,1);
  auVar2 = vpinsrd_avx(auVar2,uVar40,2);
  vpinsrd_avx(auVar2,uVar40,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar40),uVar40,1);
  auVar2 = vpinsrd_avx(auVar2,uVar40,2);
  vpinsrd_avx(auVar2,uVar40,3);
  uVar40 = piVar41[6];
  auVar2 = vpinsrd_avx(ZEXT416(uVar40),uVar40,1);
  auVar2 = vpinsrd_avx(auVar2,uVar40,2);
  vpinsrd_avx(auVar2,uVar40,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar40),uVar40,1);
  auVar2 = vpinsrd_avx(auVar2,uVar40,2);
  vpinsrd_avx(auVar2,uVar40,3);
  uVar40 = -piVar41[0x3a];
  auVar2 = vpinsrd_avx(ZEXT416(uVar40),uVar40,1);
  auVar2 = vpinsrd_avx(auVar2,uVar40,2);
  vpinsrd_avx(auVar2,uVar40,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar40),uVar40,1);
  auVar2 = vpinsrd_avx(auVar2,uVar40,2);
  vpinsrd_avx(auVar2,uVar40,3);
  uVar40 = 1 << (in_DL - 1U & 0x1f);
  auVar2 = vpinsrd_avx(ZEXT416(uVar40),uVar40,1);
  auVar2 = vpinsrd_avx(auVar2,uVar40,2);
  auVar2 = vpinsrd_avx(auVar2,uVar40,3);
  auVar3 = vpinsrd_avx(ZEXT416(uVar40),uVar40,1);
  auVar3 = vpinsrd_avx(auVar3,uVar40,2);
  auVar3 = vpinsrd_avx(auVar3,uVar40,3);
  uStack_90 = auVar3._0_8_;
  uStack_88 = auVar3._8_8_;
  uStack_58 = SUB328(ZEXT832(0),4);
  for (local_29c4 = 0; local_29c4 < in_ECX; local_29c4 = local_29c4 + 1) {
    pauVar42 = (undefined1 (*) [32])(in_RDI + (long)local_29c4 * 0x20);
    auVar52 = vpsubd_avx2(ZEXT832(uStack_58) << 0x40,
                          *(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 0xf + local_29c4) * 0x20))
    ;
    auVar47 = vpsubd_avx2(ZEXT832(uStack_58) << 0x40,
                          *(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 7 + local_29c4) * 0x20));
    auVar51 = vpsubd_avx2(ZEXT832(uStack_58) << 0x40,
                          *(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 3 + local_29c4) * 0x20));
    pauVar43 = (undefined1 (*) [32])(in_RDI + (long)(in_ECX * 0xc + local_29c4) * 0x20);
    auVar58 = vpsubd_avx2(ZEXT832(uStack_58) << 0x40,
                          *(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 0xb + local_29c4) * 0x20))
    ;
    auVar50 = vpsubd_avx2(ZEXT832(uStack_58) << 0x40,
                          *(undefined1 (*) [32])(in_RDI + (long)(in_ECX + local_29c4) * 0x20));
    pauVar44 = (undefined1 (*) [32])(in_RDI + (long)(in_ECX * 0xe + local_29c4) * 0x20);
    auVar56 = vpsubd_avx2(ZEXT832(uStack_58) << 0x40,
                          *(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 9 + local_29c4) * 0x20));
    pauVar45 = (undefined1 (*) [32])(in_RDI + (long)(in_ECX * 2 + local_29c4) * 0x20);
    auVar49 = vpsubd_avx2(ZEXT832(uStack_58) << 0x40,
                          *(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 0xd + local_29c4) * 0x20))
    ;
    auVar54 = vpsubd_avx2(ZEXT832(uStack_58) << 0x40,
                          *(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 5 + local_29c4) * 0x20));
    auVar35._16_8_ = uStack_9d0;
    auVar35._0_16_ = auVar1;
    auVar35._24_8_ = uStack_9c8;
    auVar62 = vpmulld_avx2(auVar47,auVar35);
    auVar34._16_8_ = uStack_9d0;
    auVar34._0_16_ = auVar1;
    auVar34._24_8_ = uStack_9c8;
    auVar61 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 8 + local_29c4) * 0x20),
                           auVar34);
    auVar47 = vpaddd_avx2(auVar62,auVar61);
    auVar12._16_8_ = uStack_90;
    auVar12._0_16_ = auVar2;
    auVar12._24_8_ = uStack_88;
    auVar47 = vpaddd_avx2(auVar47,auVar12);
    auVar60 = vpsrad_avx2(auVar47,ZEXT416((uint)(int)in_DL));
    auVar47 = vpsubd_avx2(auVar62,auVar61);
    auVar11._16_8_ = uStack_90;
    auVar11._0_16_ = auVar2;
    auVar11._24_8_ = uStack_88;
    auVar47 = vpaddd_avx2(auVar47,auVar11);
    auVar59 = vpsrad_avx2(auVar47,ZEXT416((uint)(int)in_DL));
    auVar33._16_8_ = uStack_9d0;
    auVar33._0_16_ = auVar1;
    auVar33._24_8_ = uStack_9c8;
    auVar62 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 4 + local_29c4) * 0x20),
                           auVar33);
    auVar32._16_8_ = uStack_9d0;
    auVar32._0_16_ = auVar1;
    auVar32._24_8_ = uStack_9c8;
    auVar61 = vpmulld_avx2(auVar58,auVar32);
    auVar47 = vpaddd_avx2(auVar62,auVar61);
    auVar10._16_8_ = uStack_90;
    auVar10._0_16_ = auVar2;
    auVar10._24_8_ = uStack_88;
    auVar47 = vpaddd_avx2(auVar47,auVar10);
    auVar58 = vpsrad_avx2(auVar47,ZEXT416((uint)(int)in_DL));
    auVar47 = vpsubd_avx2(auVar62,auVar61);
    auVar9._16_8_ = uStack_90;
    auVar9._0_16_ = auVar2;
    auVar9._24_8_ = uStack_88;
    auVar47 = vpaddd_avx2(auVar47,auVar9);
    auVar57 = vpsrad_avx2(auVar47,ZEXT416((uint)(int)in_DL));
    auVar31._16_8_ = uStack_9d0;
    auVar31._0_16_ = auVar1;
    auVar31._24_8_ = uStack_9c8;
    auVar62 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 6 + local_29c4) * 0x20),
                           auVar31);
    auVar30._16_8_ = uStack_9d0;
    auVar30._0_16_ = auVar1;
    auVar30._24_8_ = uStack_9c8;
    auVar61 = vpmulld_avx2(auVar56,auVar30);
    auVar47 = vpaddd_avx2(auVar62,auVar61);
    auVar8._16_8_ = uStack_90;
    auVar8._0_16_ = auVar2;
    auVar8._24_8_ = uStack_88;
    auVar47 = vpaddd_avx2(auVar47,auVar8);
    auVar56 = vpsrad_avx2(auVar47,ZEXT416((uint)(int)in_DL));
    auVar47 = vpsubd_avx2(auVar62,auVar61);
    auVar53._16_8_ = uStack_90;
    auVar53._0_16_ = auVar2;
    auVar53._24_8_ = uStack_88;
    auVar47 = vpaddd_avx2(auVar47,auVar53);
    auVar55 = vpsrad_avx2(auVar47,ZEXT416((uint)(int)in_DL));
    auVar29._16_8_ = uStack_9d0;
    auVar29._0_16_ = auVar1;
    auVar29._24_8_ = uStack_9c8;
    auVar62 = vpmulld_avx2(auVar54,auVar29);
    auVar28._16_8_ = uStack_9d0;
    auVar28._0_16_ = auVar1;
    auVar28._24_8_ = uStack_9c8;
    auVar61 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 10 + local_29c4) * 0x20),
                           auVar28);
    auVar47 = vpaddd_avx2(auVar62,auVar61);
    auVar54._16_8_ = uStack_90;
    auVar54._0_16_ = auVar2;
    auVar54._24_8_ = uStack_88;
    auVar47 = vpaddd_avx2(auVar47,auVar54);
    auVar54 = vpsrad_avx2(auVar47,ZEXT416((uint)(int)in_DL));
    auVar47 = vpsubd_avx2(auVar62,auVar61);
    auVar62._16_8_ = uStack_90;
    auVar62._0_16_ = auVar2;
    auVar62._24_8_ = uStack_88;
    auVar47 = vpaddd_avx2(auVar47,auVar62);
    auVar53 = vpsrad_avx2(auVar47,ZEXT416((uint)(int)in_DL));
    auVar47 = vpaddd_avx2(*pauVar42,auVar60);
    auVar62 = vpaddd_avx2(auVar52,auVar59);
    auVar48 = vpsubd_avx2(*pauVar42,auVar60);
    auVar52 = vpsubd_avx2(auVar52,auVar59);
    vpaddd_avx2(auVar51,auVar58);
    vpaddd_avx2(*pauVar43,auVar57);
    vpsubd_avx2(auVar51,auVar58);
    vpsubd_avx2(*pauVar43,auVar57);
    auVar61 = vpaddd_avx2(auVar50,auVar56);
    auVar60 = vpaddd_avx2(*pauVar44,auVar55);
    auVar51 = vpsubd_avx2(auVar50,auVar56);
    auVar55 = vpsubd_avx2(*pauVar44,auVar55);
    vpaddd_avx2(*pauVar45,auVar54);
    vpaddd_avx2(auVar49,auVar53);
    vpsubd_avx2(*pauVar45,auVar54);
    vpsubd_avx2(auVar49,auVar53);
    local_2720 = auVar52._0_8_;
    uStack_2718 = auVar52._8_8_;
    uStack_2710 = auVar52._16_8_;
    uStack_2708 = auVar52._24_8_;
    av1_half_btf_avx2((__m256i *)CONCAT44(uVar82,uVar39),(__m256i *)CONCAT44(uVar81,uVar80),
                      (__m256i *)CONCAT44(uVar38,uVar79),(__m256i *)CONCAT44(uVar78,uVar37),
                      (__m256i *)CONCAT44(uVar77,uVar36),bit_00);
    local_2900._8_8_ = uStack_2718;
    local_2900._0_8_ = local_2720;
    uVar63 = uStack_2710;
    uVar70 = uStack_2708;
    av1_half_btf_avx2((__m256i *)CONCAT44(uVar82,uVar39),(__m256i *)CONCAT44(uVar81,uVar80),
                      (__m256i *)CONCAT44(uVar38,uVar79),(__m256i *)CONCAT44(uVar78,uVar37),
                      (__m256i *)CONCAT44(uVar77,uVar36),bit_00);
    local_28e0._8_8_ = uStack_2718;
    local_28e0._0_8_ = local_2720;
    uVar64 = uVar63;
    uVar71 = uVar70;
    av1_half_btf_avx2((__m256i *)CONCAT44(uVar82,uVar39),(__m256i *)CONCAT44(uVar81,uVar80),
                      (__m256i *)CONCAT44(uVar38,uVar79),(__m256i *)CONCAT44(uVar78,uVar37),
                      (__m256i *)CONCAT44(uVar77,uVar36),bit_00);
    local_28c0._8_8_ = uStack_2718;
    local_28c0._0_8_ = local_2720;
    uVar65 = uVar64;
    uVar72 = uVar71;
    av1_half_btf_avx2((__m256i *)CONCAT44(uVar82,uVar39),(__m256i *)CONCAT44(uVar81,uVar80),
                      (__m256i *)CONCAT44(uVar38,uVar79),(__m256i *)CONCAT44(uVar78,uVar37),
                      (__m256i *)CONCAT44(uVar77,uVar36),bit_00);
    local_28a0._8_8_ = uStack_2718;
    local_28a0._0_8_ = local_2720;
    local_2620 = auVar55._0_8_;
    uStack_2618 = auVar55._8_8_;
    uStack_2610 = auVar55._16_8_;
    uStack_2608 = auVar55._24_8_;
    av1_half_btf_avx2((__m256i *)CONCAT44(uVar82,uVar39),(__m256i *)CONCAT44(uVar81,uVar80),
                      (__m256i *)CONCAT44(uVar38,uVar79),(__m256i *)CONCAT44(uVar78,uVar37),
                      (__m256i *)CONCAT44(uVar77,uVar36),bit_00);
    local_2800._8_8_ = uStack_2618;
    local_2800._0_8_ = local_2620;
    uVar66 = uStack_2610;
    uVar73 = uStack_2608;
    av1_half_btf_avx2((__m256i *)CONCAT44(uVar82,uVar39),(__m256i *)CONCAT44(uVar81,uVar80),
                      (__m256i *)CONCAT44(uVar38,uVar79),(__m256i *)CONCAT44(uVar78,uVar37),
                      (__m256i *)CONCAT44(uVar77,uVar36),bit_00);
    local_27e0._8_8_ = uStack_2618;
    local_27e0._0_8_ = local_2620;
    uVar67 = uVar66;
    uVar74 = uVar73;
    av1_half_btf_avx2((__m256i *)CONCAT44(uVar82,uVar39),(__m256i *)CONCAT44(uVar81,uVar80),
                      (__m256i *)CONCAT44(uVar38,uVar79),(__m256i *)CONCAT44(uVar78,uVar37),
                      (__m256i *)CONCAT44(uVar77,uVar36),bit_00);
    local_27c0._8_8_ = uStack_2618;
    local_27c0._0_8_ = local_2620;
    uVar68 = uVar67;
    uVar75 = uVar74;
    av1_half_btf_avx2((__m256i *)CONCAT44(uVar82,uVar39),(__m256i *)CONCAT44(uVar81,uVar80),
                      (__m256i *)CONCAT44(uVar38,uVar79),(__m256i *)CONCAT44(uVar78,uVar37),
                      (__m256i *)CONCAT44(uVar77,uVar36),bit_00);
    local_27a0._8_8_ = uStack_2618;
    local_27a0._0_8_ = local_2620;
    auVar59._16_8_ = uStack_2710;
    auVar59._0_16_ = local_2900;
    auVar59._24_8_ = uStack_2708;
    auVar59 = vpaddd_avx2(auVar47,auVar59);
    auVar58._16_8_ = uVar63;
    auVar58._0_16_ = local_28e0;
    auVar58._24_8_ = uVar70;
    auVar58 = vpaddd_avx2(auVar62,auVar58);
    auVar57._16_8_ = uVar64;
    auVar57._0_16_ = local_28c0;
    auVar57._24_8_ = uVar71;
    auVar57 = vpaddd_avx2(auVar48,auVar57);
    auVar56._16_8_ = uVar65;
    auVar56._0_16_ = local_28a0;
    auVar56._24_8_ = uVar72;
    auVar56 = vpaddd_avx2(auVar52,auVar56);
    auVar27._16_8_ = uStack_2710;
    auVar27._0_16_ = local_2900;
    auVar27._24_8_ = uStack_2708;
    auVar47 = vpsubd_avx2(auVar47,auVar27);
    auVar26._16_8_ = uVar63;
    auVar26._0_16_ = local_28e0;
    auVar26._24_8_ = uVar70;
    auVar62 = vpsubd_avx2(auVar62,auVar26);
    auVar25._16_8_ = uVar64;
    auVar25._0_16_ = local_28c0;
    auVar25._24_8_ = uVar71;
    auVar54 = vpsubd_avx2(auVar48,auVar25);
    auVar24._16_8_ = uVar65;
    auVar24._0_16_ = local_28a0;
    auVar24._24_8_ = uVar72;
    auVar53 = vpsubd_avx2(auVar52,auVar24);
    auVar7._16_8_ = uStack_2610;
    auVar7._0_16_ = local_2800;
    auVar7._24_8_ = uStack_2608;
    vpaddd_avx2(auVar61,auVar7);
    auVar6._16_8_ = uVar66;
    auVar6._0_16_ = local_27e0;
    auVar6._24_8_ = uVar73;
    vpaddd_avx2(auVar60,auVar6);
    auVar5._16_8_ = uVar67;
    auVar5._0_16_ = local_27c0;
    auVar5._24_8_ = uVar74;
    vpaddd_avx2(auVar51,auVar5);
    auVar4._16_8_ = uVar68;
    auVar4._0_16_ = local_27a0;
    auVar4._24_8_ = uVar75;
    vpaddd_avx2(auVar55,auVar4);
    auVar23._16_8_ = uStack_2610;
    auVar23._0_16_ = local_2800;
    auVar23._24_8_ = uStack_2608;
    vpsubd_avx2(auVar61,auVar23);
    auVar22._16_8_ = uVar66;
    auVar22._0_16_ = local_27e0;
    auVar22._24_8_ = uVar73;
    vpsubd_avx2(auVar60,auVar22);
    auVar21._16_8_ = uVar67;
    auVar21._0_16_ = local_27c0;
    auVar21._24_8_ = uVar74;
    vpsubd_avx2(auVar51,auVar21);
    auVar20._16_8_ = uVar68;
    auVar20._0_16_ = local_27a0;
    auVar20._24_8_ = uVar75;
    vpsubd_avx2(auVar55,auVar20);
    local_26a0 = auVar53._0_8_;
    uStack_2698 = auVar53._8_8_;
    uStack_2690 = auVar53._16_8_;
    uStack_2688 = auVar53._24_8_;
    av1_half_btf_avx2((__m256i *)CONCAT44(uVar82,uVar39),(__m256i *)CONCAT44(uVar81,uVar80),
                      (__m256i *)CONCAT44(uVar38,uVar79),(__m256i *)CONCAT44(uVar78,uVar37),
                      (__m256i *)CONCAT44(uVar77,uVar36),bit_00);
    local_2880._8_8_ = uStack_2698;
    local_2880._0_8_ = local_26a0;
    uVar63 = uStack_2690;
    uVar70 = uStack_2688;
    av1_half_btf_avx2((__m256i *)CONCAT44(uVar82,uVar39),(__m256i *)CONCAT44(uVar81,uVar80),
                      (__m256i *)CONCAT44(uVar38,uVar79),(__m256i *)CONCAT44(uVar78,uVar37),
                      (__m256i *)CONCAT44(uVar77,uVar36),bit_00);
    local_2860._8_8_ = uStack_2698;
    local_2860._0_8_ = local_26a0;
    uVar64 = uVar63;
    uVar71 = uVar70;
    av1_half_btf_avx2((__m256i *)CONCAT44(uVar82,uVar39),(__m256i *)CONCAT44(uVar81,uVar80),
                      (__m256i *)CONCAT44(uVar38,uVar79),(__m256i *)CONCAT44(uVar78,uVar37),
                      (__m256i *)CONCAT44(uVar77,uVar36),bit_00);
    local_2840._8_8_ = uStack_2698;
    local_2840._0_8_ = local_26a0;
    uVar65 = uVar64;
    uVar72 = uVar71;
    av1_half_btf_avx2((__m256i *)CONCAT44(uVar82,uVar39),(__m256i *)CONCAT44(uVar81,uVar80),
                      (__m256i *)CONCAT44(uVar38,uVar79),(__m256i *)CONCAT44(uVar78,uVar37),
                      (__m256i *)CONCAT44(uVar77,uVar36),bit_00);
    local_2820._8_8_ = uStack_2698;
    local_2820._0_8_ = local_26a0;
    uVar66 = uVar65;
    uVar73 = uVar72;
    av1_half_btf_avx2((__m256i *)CONCAT44(uVar82,uVar39),(__m256i *)CONCAT44(uVar81,uVar80),
                      (__m256i *)CONCAT44(uVar38,uVar79),(__m256i *)CONCAT44(uVar78,uVar37),
                      (__m256i *)CONCAT44(uVar77,uVar36),bit_00);
    local_2800._8_8_ = uStack_2698;
    local_2800._0_8_ = local_26a0;
    uVar67 = uVar66;
    uVar74 = uVar73;
    av1_half_btf_avx2((__m256i *)CONCAT44(uVar82,uVar39),(__m256i *)CONCAT44(uVar81,uVar80),
                      (__m256i *)CONCAT44(uVar38,uVar79),(__m256i *)CONCAT44(uVar78,uVar37),
                      (__m256i *)CONCAT44(uVar77,uVar36),bit_00);
    local_27e0._8_8_ = uStack_2698;
    local_27e0._0_8_ = local_26a0;
    uVar68 = uVar67;
    uVar75 = uVar74;
    av1_half_btf_avx2((__m256i *)CONCAT44(uVar82,uVar39),(__m256i *)CONCAT44(uVar81,uVar80),
                      (__m256i *)CONCAT44(uVar38,uVar79),(__m256i *)CONCAT44(uVar78,uVar37),
                      (__m256i *)CONCAT44(uVar77,uVar36),bit_00);
    local_27c0._8_8_ = uStack_2698;
    local_27c0._0_8_ = local_26a0;
    uVar69 = uVar68;
    uVar76 = uVar75;
    av1_half_btf_avx2((__m256i *)CONCAT44(uVar82,uVar39),(__m256i *)CONCAT44(uVar81,uVar80),
                      (__m256i *)CONCAT44(uVar38,uVar79),(__m256i *)CONCAT44(uVar78,uVar37),
                      (__m256i *)CONCAT44(uVar77,uVar36),bit_00);
    local_27a0._8_8_ = uStack_2698;
    local_27a0._0_8_ = local_26a0;
    auVar48._16_8_ = uStack_2690;
    auVar48._0_16_ = local_2880;
    auVar48._24_8_ = uStack_2688;
    vpaddd_avx2(auVar59,auVar48);
    auVar49._16_8_ = uVar63;
    auVar49._0_16_ = local_2860;
    auVar49._24_8_ = uVar70;
    vpaddd_avx2(auVar58,auVar49);
    auVar50._16_8_ = uVar64;
    auVar50._0_16_ = local_2840;
    auVar50._24_8_ = uVar71;
    vpaddd_avx2(auVar57,auVar50);
    auVar51._16_8_ = uVar65;
    auVar51._0_16_ = local_2820;
    auVar51._24_8_ = uVar72;
    vpaddd_avx2(auVar56,auVar51);
    auVar52._16_8_ = uVar66;
    auVar52._0_16_ = local_2800;
    auVar52._24_8_ = uVar73;
    vpaddd_avx2(auVar47,auVar52);
    auVar55._16_8_ = uVar67;
    auVar55._0_16_ = local_27e0;
    auVar55._24_8_ = uVar74;
    vpaddd_avx2(auVar62,auVar55);
    auVar60._16_8_ = uVar68;
    auVar60._0_16_ = local_27c0;
    auVar60._24_8_ = uVar75;
    vpaddd_avx2(auVar54,auVar60);
    auVar61._16_8_ = uVar69;
    auVar61._0_16_ = local_27a0;
    auVar61._24_8_ = uVar76;
    vpaddd_avx2(auVar53,auVar61);
    auVar19._16_8_ = uStack_2690;
    auVar19._0_16_ = local_2880;
    auVar19._24_8_ = uStack_2688;
    vpsubd_avx2(auVar59,auVar19);
    auVar18._16_8_ = uVar63;
    auVar18._0_16_ = local_2860;
    auVar18._24_8_ = uVar70;
    vpsubd_avx2(auVar58,auVar18);
    auVar17._16_8_ = uVar64;
    auVar17._0_16_ = local_2840;
    auVar17._24_8_ = uVar71;
    vpsubd_avx2(auVar57,auVar17);
    auVar16._16_8_ = uVar65;
    auVar16._0_16_ = local_2820;
    auVar16._24_8_ = uVar72;
    vpsubd_avx2(auVar56,auVar16);
    auVar15._16_8_ = uVar66;
    auVar15._0_16_ = local_2800;
    auVar15._24_8_ = uVar73;
    vpsubd_avx2(auVar47,auVar15);
    auVar14._16_8_ = uVar67;
    auVar14._0_16_ = local_27e0;
    auVar14._24_8_ = uVar74;
    vpsubd_avx2(auVar62,auVar14);
    auVar13._16_8_ = uVar68;
    auVar13._0_16_ = local_27c0;
    auVar13._24_8_ = uVar75;
    vpsubd_avx2(auVar54,auVar13);
    auVar47._16_8_ = uVar69;
    auVar47._0_16_ = local_27a0;
    auVar47._24_8_ = uVar76;
    auVar47 = vpsubd_avx2(auVar53,auVar47);
    av1_half_btf_avx2((__m256i *)CONCAT44(uVar82,uVar39),(__m256i *)CONCAT44(uVar81,uVar80),
                      (__m256i *)CONCAT44(uVar38,uVar79),(__m256i *)CONCAT44(uVar78,uVar37),
                      (__m256i *)CONCAT44(uVar77,uVar36),bit_00);
    auVar48 = auVar47;
    av1_half_btf_avx2((__m256i *)CONCAT44(uVar82,uVar39),(__m256i *)CONCAT44(uVar81,uVar80),
                      (__m256i *)CONCAT44(uVar38,uVar79),(__m256i *)CONCAT44(uVar78,uVar37),
                      (__m256i *)CONCAT44(uVar77,uVar36),bit_00);
    auVar49 = auVar48;
    av1_half_btf_avx2((__m256i *)CONCAT44(uVar82,uVar39),(__m256i *)CONCAT44(uVar81,uVar80),
                      (__m256i *)CONCAT44(uVar38,uVar79),(__m256i *)CONCAT44(uVar78,uVar37),
                      (__m256i *)CONCAT44(uVar77,uVar36),bit_00);
    auVar50 = auVar49;
    av1_half_btf_avx2((__m256i *)CONCAT44(uVar82,uVar39),(__m256i *)CONCAT44(uVar81,uVar80),
                      (__m256i *)CONCAT44(uVar38,uVar79),(__m256i *)CONCAT44(uVar78,uVar37),
                      (__m256i *)CONCAT44(uVar77,uVar36),bit_00);
    auVar51 = auVar50;
    av1_half_btf_avx2((__m256i *)CONCAT44(uVar82,uVar39),(__m256i *)CONCAT44(uVar81,uVar80),
                      (__m256i *)CONCAT44(uVar38,uVar79),(__m256i *)CONCAT44(uVar78,uVar37),
                      (__m256i *)CONCAT44(uVar77,uVar36),bit_00);
    auVar52 = auVar51;
    av1_half_btf_avx2((__m256i *)CONCAT44(uVar82,uVar39),(__m256i *)CONCAT44(uVar81,uVar80),
                      (__m256i *)CONCAT44(uVar38,uVar79),(__m256i *)CONCAT44(uVar78,uVar37),
                      (__m256i *)CONCAT44(uVar77,uVar36),bit_00);
    auVar53 = auVar52;
    av1_half_btf_avx2((__m256i *)CONCAT44(uVar82,uVar39),(__m256i *)CONCAT44(uVar81,uVar80),
                      (__m256i *)CONCAT44(uVar38,uVar79),(__m256i *)CONCAT44(uVar78,uVar37),
                      (__m256i *)CONCAT44(uVar77,uVar36),bit_00);
    auVar54 = auVar53;
    av1_half_btf_avx2((__m256i *)CONCAT44(uVar82,uVar39),(__m256i *)CONCAT44(uVar81,uVar80),
                      (__m256i *)CONCAT44(uVar38,uVar79),(__m256i *)CONCAT44(uVar78,uVar37),
                      (__m256i *)CONCAT44(uVar77,uVar36),bit_00);
    auVar55 = auVar54;
    av1_half_btf_avx2((__m256i *)CONCAT44(uVar82,uVar39),(__m256i *)CONCAT44(uVar81,uVar80),
                      (__m256i *)CONCAT44(uVar38,uVar79),(__m256i *)CONCAT44(uVar78,uVar37),
                      (__m256i *)CONCAT44(uVar77,uVar36),bit_00);
    auVar56 = auVar55;
    av1_half_btf_avx2((__m256i *)CONCAT44(uVar82,uVar39),(__m256i *)CONCAT44(uVar81,uVar80),
                      (__m256i *)CONCAT44(uVar38,uVar79),(__m256i *)CONCAT44(uVar78,uVar37),
                      (__m256i *)CONCAT44(uVar77,uVar36),bit_00);
    auVar57 = auVar56;
    av1_half_btf_avx2((__m256i *)CONCAT44(uVar82,uVar39),(__m256i *)CONCAT44(uVar81,uVar80),
                      (__m256i *)CONCAT44(uVar38,uVar79),(__m256i *)CONCAT44(uVar78,uVar37),
                      (__m256i *)CONCAT44(uVar77,uVar36),bit_00);
    auVar58 = auVar57;
    av1_half_btf_avx2((__m256i *)CONCAT44(uVar82,uVar39),(__m256i *)CONCAT44(uVar81,uVar80),
                      (__m256i *)CONCAT44(uVar38,uVar79),(__m256i *)CONCAT44(uVar78,uVar37),
                      (__m256i *)CONCAT44(uVar77,uVar36),bit_00);
    auVar59 = auVar58;
    av1_half_btf_avx2((__m256i *)CONCAT44(uVar82,uVar39),(__m256i *)CONCAT44(uVar81,uVar80),
                      (__m256i *)CONCAT44(uVar38,uVar79),(__m256i *)CONCAT44(uVar78,uVar37),
                      (__m256i *)CONCAT44(uVar77,uVar36),bit_00);
    auVar60 = auVar59;
    av1_half_btf_avx2((__m256i *)CONCAT44(uVar82,uVar39),(__m256i *)CONCAT44(uVar81,uVar80),
                      (__m256i *)CONCAT44(uVar38,uVar79),(__m256i *)CONCAT44(uVar78,uVar37),
                      (__m256i *)CONCAT44(uVar77,uVar36),bit_00);
    auVar61 = auVar60;
    av1_half_btf_avx2((__m256i *)CONCAT44(uVar82,uVar39),(__m256i *)CONCAT44(uVar81,uVar80),
                      (__m256i *)CONCAT44(uVar38,uVar79),(__m256i *)CONCAT44(uVar78,uVar37),
                      (__m256i *)CONCAT44(uVar77,uVar36),bit_00);
    auVar62 = auVar61;
    av1_half_btf_avx2((__m256i *)CONCAT44(uVar82,uVar39),(__m256i *)CONCAT44(uVar81,uVar80),
                      (__m256i *)CONCAT44(uVar38,uVar79),(__m256i *)CONCAT44(uVar78,uVar37),
                      (__m256i *)CONCAT44(uVar77,uVar36),bit_00);
    local_2960 = auVar48._0_8_;
    uStack_2958 = auVar48._8_8_;
    uStack_2950 = auVar48._16_8_;
    uStack_2948 = auVar48._24_8_;
    puVar46 = (undefined8 *)(in_RSI + (long)local_29c4 * 0x20);
    *puVar46 = local_2960;
    puVar46[1] = uStack_2958;
    puVar46[2] = uStack_2950;
    puVar46[3] = uStack_2948;
    local_27c0._0_8_ = auVar61._0_8_;
    local_27c0._8_8_ = auVar61._8_8_;
    uStack_27b0 = auVar61._16_8_;
    uStack_27a8 = auVar61._24_8_;
    puVar46 = (undefined8 *)(in_RSI + (long)(in_R8D + local_29c4) * 0x20);
    *puVar46 = local_27c0._0_8_;
    puVar46[1] = local_27c0._8_8_;
    puVar46[2] = uStack_27b0;
    puVar46[3] = uStack_27a8;
    local_2920 = auVar50._0_8_;
    uStack_2918 = auVar50._8_8_;
    uStack_2910 = auVar50._16_8_;
    uStack_2908 = auVar50._24_8_;
    puVar46 = (undefined8 *)(in_RSI + (long)(in_R8D * 2 + local_29c4) * 0x20);
    *puVar46 = local_2920;
    puVar46[1] = uStack_2918;
    puVar46[2] = uStack_2910;
    puVar46[3] = uStack_2908;
    local_2800._0_8_ = auVar59._0_8_;
    local_2800._8_8_ = auVar59._8_8_;
    uStack_27f0 = auVar59._16_8_;
    uStack_27e8 = auVar59._24_8_;
    puVar46 = (undefined8 *)(in_RSI + (long)(in_R8D * 3 + local_29c4) * 0x20);
    *puVar46 = local_2800._0_8_;
    puVar46[1] = local_2800._8_8_;
    puVar46[2] = uStack_27f0;
    puVar46[3] = uStack_27e8;
    local_28e0._0_8_ = auVar52._0_8_;
    local_28e0._8_8_ = auVar52._8_8_;
    uStack_28d0 = auVar52._16_8_;
    uStack_28c8 = auVar52._24_8_;
    puVar46 = (undefined8 *)(in_RSI + (long)(in_R8D * 4 + local_29c4) * 0x20);
    *puVar46 = local_28e0._0_8_;
    puVar46[1] = local_28e0._8_8_;
    puVar46[2] = uStack_28d0;
    puVar46[3] = uStack_28c8;
    local_2840._0_8_ = auVar57._0_8_;
    local_2840._8_8_ = auVar57._8_8_;
    uStack_2830 = auVar57._16_8_;
    uStack_2828 = auVar57._24_8_;
    puVar46 = (undefined8 *)(in_RSI + (long)(in_R8D * 5 + local_29c4) * 0x20);
    *puVar46 = local_2840._0_8_;
    puVar46[1] = local_2840._8_8_;
    puVar46[2] = uStack_2830;
    puVar46[3] = uStack_2828;
    local_28a0._0_8_ = auVar54._0_8_;
    local_28a0._8_8_ = auVar54._8_8_;
    uStack_2890 = auVar54._16_8_;
    uStack_2888 = auVar54._24_8_;
    puVar46 = (undefined8 *)(in_RSI + (long)(in_R8D * 6 + local_29c4) * 0x20);
    *puVar46 = local_28a0._0_8_;
    puVar46[1] = local_28a0._8_8_;
    puVar46[2] = uStack_2890;
    puVar46[3] = uStack_2888;
    local_2880._0_8_ = auVar55._0_8_;
    local_2880._8_8_ = auVar55._8_8_;
    uStack_2870 = auVar55._16_8_;
    uStack_2868 = auVar55._24_8_;
    puVar46 = (undefined8 *)(in_RSI + (long)(in_R8D * 7 + local_29c4) * 0x20);
    *puVar46 = local_2880._0_8_;
    puVar46[1] = local_2880._8_8_;
    puVar46[2] = uStack_2870;
    puVar46[3] = uStack_2868;
    local_2860._0_8_ = auVar56._0_8_;
    local_2860._8_8_ = auVar56._8_8_;
    uStack_2850 = auVar56._16_8_;
    uStack_2848 = auVar56._24_8_;
    puVar46 = (undefined8 *)(in_RSI + (long)(in_R8D * 8 + local_29c4) * 0x20);
    *puVar46 = local_2860._0_8_;
    puVar46[1] = local_2860._8_8_;
    puVar46[2] = uStack_2850;
    puVar46[3] = uStack_2848;
    local_28c0._0_8_ = auVar53._0_8_;
    local_28c0._8_8_ = auVar53._8_8_;
    uStack_28b0 = auVar53._16_8_;
    uStack_28a8 = auVar53._24_8_;
    puVar46 = (undefined8 *)(in_RSI + (long)(in_R8D * 9 + local_29c4) * 0x20);
    *puVar46 = local_28c0._0_8_;
    puVar46[1] = local_28c0._8_8_;
    puVar46[2] = uStack_28b0;
    puVar46[3] = uStack_28a8;
    local_2820._0_8_ = auVar58._0_8_;
    local_2820._8_8_ = auVar58._8_8_;
    uStack_2810 = auVar58._16_8_;
    uStack_2808 = auVar58._24_8_;
    puVar46 = (undefined8 *)(in_RSI + (long)(in_R8D * 10 + local_29c4) * 0x20);
    *puVar46 = local_2820._0_8_;
    puVar46[1] = local_2820._8_8_;
    puVar46[2] = uStack_2810;
    puVar46[3] = uStack_2808;
    local_2900._0_8_ = auVar51._0_8_;
    local_2900._8_8_ = auVar51._8_8_;
    uStack_28f0 = auVar51._16_8_;
    uStack_28e8 = auVar51._24_8_;
    puVar46 = (undefined8 *)(in_RSI + (long)(in_R8D * 0xb + local_29c4) * 0x20);
    *puVar46 = local_2900._0_8_;
    puVar46[1] = local_2900._8_8_;
    puVar46[2] = uStack_28f0;
    puVar46[3] = uStack_28e8;
    local_27e0._0_8_ = auVar60._0_8_;
    local_27e0._8_8_ = auVar60._8_8_;
    uStack_27d0 = auVar60._16_8_;
    uStack_27c8 = auVar60._24_8_;
    puVar46 = (undefined8 *)(in_RSI + (long)(in_R8D * 0xc + local_29c4) * 0x20);
    *puVar46 = local_27e0._0_8_;
    puVar46[1] = local_27e0._8_8_;
    puVar46[2] = uStack_27d0;
    puVar46[3] = uStack_27c8;
    local_2940 = auVar49._0_8_;
    uStack_2938 = auVar49._8_8_;
    uStack_2930 = auVar49._16_8_;
    uStack_2928 = auVar49._24_8_;
    puVar46 = (undefined8 *)(in_RSI + (long)(in_R8D * 0xd + local_29c4) * 0x20);
    *puVar46 = local_2940;
    puVar46[1] = uStack_2938;
    puVar46[2] = uStack_2930;
    puVar46[3] = uStack_2928;
    local_27a0._0_8_ = auVar62._0_8_;
    local_27a0._8_8_ = auVar62._8_8_;
    uStack_2790 = auVar62._16_8_;
    uStack_2788 = auVar62._24_8_;
    puVar46 = (undefined8 *)(in_RSI + (long)(in_R8D * 0xe + local_29c4) * 0x20);
    *puVar46 = local_27a0._0_8_;
    puVar46[1] = local_27a0._8_8_;
    puVar46[2] = uStack_2790;
    puVar46[3] = uStack_2788;
    local_2980 = auVar47._0_8_;
    uStack_2978 = auVar47._8_8_;
    uStack_2970 = auVar47._16_8_;
    uStack_2968 = auVar47._24_8_;
    puVar46 = (undefined8 *)(in_RSI + (long)(in_R8D * 0xf + local_29c4) * 0x20);
    *puVar46 = local_2980;
    puVar46[1] = uStack_2978;
    puVar46[2] = uStack_2970;
    puVar46[3] = uStack_2968;
  }
  return;
}

Assistant:

static void fadst16_avx2(__m256i *in, __m256i *out, const int8_t bit,
                         const int num_cols, const int outstride) {
  const int32_t *cospi = cospi_arr(bit);
  const __m256i cospi32 = _mm256_set1_epi32(cospi[32]);
  const __m256i cospi48 = _mm256_set1_epi32(cospi[48]);
  const __m256i cospi16 = _mm256_set1_epi32(cospi[16]);
  const __m256i cospim16 = _mm256_set1_epi32(-cospi[16]);
  const __m256i cospim48 = _mm256_set1_epi32(-cospi[48]);
  const __m256i cospi8 = _mm256_set1_epi32(cospi[8]);
  const __m256i cospi56 = _mm256_set1_epi32(cospi[56]);
  const __m256i cospim56 = _mm256_set1_epi32(-cospi[56]);
  const __m256i cospim8 = _mm256_set1_epi32(-cospi[8]);
  const __m256i cospi24 = _mm256_set1_epi32(cospi[24]);
  const __m256i cospim24 = _mm256_set1_epi32(-cospi[24]);
  const __m256i cospim40 = _mm256_set1_epi32(-cospi[40]);
  const __m256i cospi40 = _mm256_set1_epi32(cospi[40]);
  const __m256i cospi2 = _mm256_set1_epi32(cospi[2]);
  const __m256i cospi62 = _mm256_set1_epi32(cospi[62]);
  const __m256i cospim2 = _mm256_set1_epi32(-cospi[2]);
  const __m256i cospi10 = _mm256_set1_epi32(cospi[10]);
  const __m256i cospi54 = _mm256_set1_epi32(cospi[54]);
  const __m256i cospim10 = _mm256_set1_epi32(-cospi[10]);
  const __m256i cospi18 = _mm256_set1_epi32(cospi[18]);
  const __m256i cospi46 = _mm256_set1_epi32(cospi[46]);
  const __m256i cospim18 = _mm256_set1_epi32(-cospi[18]);
  const __m256i cospi26 = _mm256_set1_epi32(cospi[26]);
  const __m256i cospi38 = _mm256_set1_epi32(cospi[38]);
  const __m256i cospim26 = _mm256_set1_epi32(-cospi[26]);
  const __m256i cospi34 = _mm256_set1_epi32(cospi[34]);
  const __m256i cospi30 = _mm256_set1_epi32(cospi[30]);
  const __m256i cospim34 = _mm256_set1_epi32(-cospi[34]);
  const __m256i cospi42 = _mm256_set1_epi32(cospi[42]);
  const __m256i cospi22 = _mm256_set1_epi32(cospi[22]);
  const __m256i cospim42 = _mm256_set1_epi32(-cospi[42]);
  const __m256i cospi50 = _mm256_set1_epi32(cospi[50]);
  const __m256i cospi14 = _mm256_set1_epi32(cospi[14]);
  const __m256i cospim50 = _mm256_set1_epi32(-cospi[50]);
  const __m256i cospi58 = _mm256_set1_epi32(cospi[58]);
  const __m256i cospi6 = _mm256_set1_epi32(cospi[6]);
  const __m256i cospim58 = _mm256_set1_epi32(-cospi[58]);
  const __m256i rnding = _mm256_set1_epi32(1 << (bit - 1));
  const __m256i zero = _mm256_setzero_si256();

  __m256i u[16], v[16], x, y;
  int col;

  for (col = 0; col < num_cols; ++col) {
    // stage 0
    // stage 1
    u[0] = in[0 * num_cols + col];
    u[1] = _mm256_sub_epi32(zero, in[15 * num_cols + col]);
    u[2] = _mm256_sub_epi32(zero, in[7 * num_cols + col]);
    u[3] = in[8 * num_cols + col];
    u[4] = _mm256_sub_epi32(zero, in[3 * num_cols + col]);
    u[5] = in[12 * num_cols + col];
    u[6] = in[4 * num_cols + col];
    u[7] = _mm256_sub_epi32(zero, in[11 * num_cols + col]);
    u[8] = _mm256_sub_epi32(zero, in[1 * num_cols + col]);
    u[9] = in[14 * num_cols + col];
    u[10] = in[6 * num_cols + col];
    u[11] = _mm256_sub_epi32(zero, in[9 * num_cols + col]);
    u[12] = in[2 * num_cols + col];
    u[13] = _mm256_sub_epi32(zero, in[13 * num_cols + col]);
    u[14] = _mm256_sub_epi32(zero, in[5 * num_cols + col]);
    u[15] = in[10 * num_cols + col];

    // stage 2
    v[0] = u[0];
    v[1] = u[1];

    x = _mm256_mullo_epi32(u[2], cospi32);
    y = _mm256_mullo_epi32(u[3], cospi32);
    v[2] = _mm256_add_epi32(x, y);
    v[2] = _mm256_add_epi32(v[2], rnding);
    v[2] = _mm256_srai_epi32(v[2], bit);

    v[3] = _mm256_sub_epi32(x, y);
    v[3] = _mm256_add_epi32(v[3], rnding);
    v[3] = _mm256_srai_epi32(v[3], bit);

    v[4] = u[4];
    v[5] = u[5];

    x = _mm256_mullo_epi32(u[6], cospi32);
    y = _mm256_mullo_epi32(u[7], cospi32);
    v[6] = _mm256_add_epi32(x, y);
    v[6] = _mm256_add_epi32(v[6], rnding);
    v[6] = _mm256_srai_epi32(v[6], bit);

    v[7] = _mm256_sub_epi32(x, y);
    v[7] = _mm256_add_epi32(v[7], rnding);
    v[7] = _mm256_srai_epi32(v[7], bit);

    v[8] = u[8];
    v[9] = u[9];

    x = _mm256_mullo_epi32(u[10], cospi32);
    y = _mm256_mullo_epi32(u[11], cospi32);
    v[10] = _mm256_add_epi32(x, y);
    v[10] = _mm256_add_epi32(v[10], rnding);
    v[10] = _mm256_srai_epi32(v[10], bit);

    v[11] = _mm256_sub_epi32(x, y);
    v[11] = _mm256_add_epi32(v[11], rnding);
    v[11] = _mm256_srai_epi32(v[11], bit);

    v[12] = u[12];
    v[13] = u[13];

    x = _mm256_mullo_epi32(u[14], cospi32);
    y = _mm256_mullo_epi32(u[15], cospi32);
    v[14] = _mm256_add_epi32(x, y);
    v[14] = _mm256_add_epi32(v[14], rnding);
    v[14] = _mm256_srai_epi32(v[14], bit);

    v[15] = _mm256_sub_epi32(x, y);
    v[15] = _mm256_add_epi32(v[15], rnding);
    v[15] = _mm256_srai_epi32(v[15], bit);

    // stage 3
    u[0] = _mm256_add_epi32(v[0], v[2]);
    u[1] = _mm256_add_epi32(v[1], v[3]);
    u[2] = _mm256_sub_epi32(v[0], v[2]);
    u[3] = _mm256_sub_epi32(v[1], v[3]);
    u[4] = _mm256_add_epi32(v[4], v[6]);
    u[5] = _mm256_add_epi32(v[5], v[7]);
    u[6] = _mm256_sub_epi32(v[4], v[6]);
    u[7] = _mm256_sub_epi32(v[5], v[7]);
    u[8] = _mm256_add_epi32(v[8], v[10]);
    u[9] = _mm256_add_epi32(v[9], v[11]);
    u[10] = _mm256_sub_epi32(v[8], v[10]);
    u[11] = _mm256_sub_epi32(v[9], v[11]);
    u[12] = _mm256_add_epi32(v[12], v[14]);
    u[13] = _mm256_add_epi32(v[13], v[15]);
    u[14] = _mm256_sub_epi32(v[12], v[14]);
    u[15] = _mm256_sub_epi32(v[13], v[15]);

    // stage 4
    v[0] = u[0];
    v[1] = u[1];
    v[2] = u[2];
    v[3] = u[3];
    v[4] = av1_half_btf_avx2(&cospi16, &u[4], &cospi48, &u[5], &rnding, bit);
    v[5] = av1_half_btf_avx2(&cospi48, &u[4], &cospim16, &u[5], &rnding, bit);
    v[6] = av1_half_btf_avx2(&cospim48, &u[6], &cospi16, &u[7], &rnding, bit);
    v[7] = av1_half_btf_avx2(&cospi16, &u[6], &cospi48, &u[7], &rnding, bit);
    v[8] = u[8];
    v[9] = u[9];
    v[10] = u[10];
    v[11] = u[11];
    v[12] = av1_half_btf_avx2(&cospi16, &u[12], &cospi48, &u[13], &rnding, bit);
    v[13] =
        av1_half_btf_avx2(&cospi48, &u[12], &cospim16, &u[13], &rnding, bit);
    v[14] =
        av1_half_btf_avx2(&cospim48, &u[14], &cospi16, &u[15], &rnding, bit);
    v[15] = av1_half_btf_avx2(&cospi16, &u[14], &cospi48, &u[15], &rnding, bit);

    // stage 5
    u[0] = _mm256_add_epi32(v[0], v[4]);
    u[1] = _mm256_add_epi32(v[1], v[5]);
    u[2] = _mm256_add_epi32(v[2], v[6]);
    u[3] = _mm256_add_epi32(v[3], v[7]);
    u[4] = _mm256_sub_epi32(v[0], v[4]);
    u[5] = _mm256_sub_epi32(v[1], v[5]);
    u[6] = _mm256_sub_epi32(v[2], v[6]);
    u[7] = _mm256_sub_epi32(v[3], v[7]);
    u[8] = _mm256_add_epi32(v[8], v[12]);
    u[9] = _mm256_add_epi32(v[9], v[13]);
    u[10] = _mm256_add_epi32(v[10], v[14]);
    u[11] = _mm256_add_epi32(v[11], v[15]);
    u[12] = _mm256_sub_epi32(v[8], v[12]);
    u[13] = _mm256_sub_epi32(v[9], v[13]);
    u[14] = _mm256_sub_epi32(v[10], v[14]);
    u[15] = _mm256_sub_epi32(v[11], v[15]);

    // stage 6
    v[0] = u[0];
    v[1] = u[1];
    v[2] = u[2];
    v[3] = u[3];
    v[4] = u[4];
    v[5] = u[5];
    v[6] = u[6];
    v[7] = u[7];
    v[8] = av1_half_btf_avx2(&cospi8, &u[8], &cospi56, &u[9], &rnding, bit);
    v[9] = av1_half_btf_avx2(&cospi56, &u[8], &cospim8, &u[9], &rnding, bit);
    v[10] = av1_half_btf_avx2(&cospi40, &u[10], &cospi24, &u[11], &rnding, bit);
    v[11] =
        av1_half_btf_avx2(&cospi24, &u[10], &cospim40, &u[11], &rnding, bit);
    v[12] = av1_half_btf_avx2(&cospim56, &u[12], &cospi8, &u[13], &rnding, bit);
    v[13] = av1_half_btf_avx2(&cospi8, &u[12], &cospi56, &u[13], &rnding, bit);
    v[14] =
        av1_half_btf_avx2(&cospim24, &u[14], &cospi40, &u[15], &rnding, bit);
    v[15] = av1_half_btf_avx2(&cospi40, &u[14], &cospi24, &u[15], &rnding, bit);

    // stage 7
    u[0] = _mm256_add_epi32(v[0], v[8]);
    u[1] = _mm256_add_epi32(v[1], v[9]);
    u[2] = _mm256_add_epi32(v[2], v[10]);
    u[3] = _mm256_add_epi32(v[3], v[11]);
    u[4] = _mm256_add_epi32(v[4], v[12]);
    u[5] = _mm256_add_epi32(v[5], v[13]);
    u[6] = _mm256_add_epi32(v[6], v[14]);
    u[7] = _mm256_add_epi32(v[7], v[15]);
    u[8] = _mm256_sub_epi32(v[0], v[8]);
    u[9] = _mm256_sub_epi32(v[1], v[9]);
    u[10] = _mm256_sub_epi32(v[2], v[10]);
    u[11] = _mm256_sub_epi32(v[3], v[11]);
    u[12] = _mm256_sub_epi32(v[4], v[12]);
    u[13] = _mm256_sub_epi32(v[5], v[13]);
    u[14] = _mm256_sub_epi32(v[6], v[14]);
    u[15] = _mm256_sub_epi32(v[7], v[15]);

    // stage 8
    v[0] = av1_half_btf_avx2(&cospi2, &u[0], &cospi62, &u[1], &rnding, bit);
    v[1] = av1_half_btf_avx2(&cospi62, &u[0], &cospim2, &u[1], &rnding, bit);
    v[2] = av1_half_btf_avx2(&cospi10, &u[2], &cospi54, &u[3], &rnding, bit);
    v[3] = av1_half_btf_avx2(&cospi54, &u[2], &cospim10, &u[3], &rnding, bit);
    v[4] = av1_half_btf_avx2(&cospi18, &u[4], &cospi46, &u[5], &rnding, bit);
    v[5] = av1_half_btf_avx2(&cospi46, &u[4], &cospim18, &u[5], &rnding, bit);
    v[6] = av1_half_btf_avx2(&cospi26, &u[6], &cospi38, &u[7], &rnding, bit);
    v[7] = av1_half_btf_avx2(&cospi38, &u[6], &cospim26, &u[7], &rnding, bit);
    v[8] = av1_half_btf_avx2(&cospi34, &u[8], &cospi30, &u[9], &rnding, bit);
    v[9] = av1_half_btf_avx2(&cospi30, &u[8], &cospim34, &u[9], &rnding, bit);
    v[10] = av1_half_btf_avx2(&cospi42, &u[10], &cospi22, &u[11], &rnding, bit);
    v[11] =
        av1_half_btf_avx2(&cospi22, &u[10], &cospim42, &u[11], &rnding, bit);
    v[12] = av1_half_btf_avx2(&cospi50, &u[12], &cospi14, &u[13], &rnding, bit);
    v[13] =
        av1_half_btf_avx2(&cospi14, &u[12], &cospim50, &u[13], &rnding, bit);
    v[14] = av1_half_btf_avx2(&cospi58, &u[14], &cospi6, &u[15], &rnding, bit);
    v[15] = av1_half_btf_avx2(&cospi6, &u[14], &cospim58, &u[15], &rnding, bit);

    // stage 9
    out[0 * outstride + col] = v[1];
    out[1 * outstride + col] = v[14];
    out[2 * outstride + col] = v[3];
    out[3 * outstride + col] = v[12];
    out[4 * outstride + col] = v[5];
    out[5 * outstride + col] = v[10];
    out[6 * outstride + col] = v[7];
    out[7 * outstride + col] = v[8];
    out[8 * outstride + col] = v[9];
    out[9 * outstride + col] = v[6];
    out[10 * outstride + col] = v[11];
    out[11 * outstride + col] = v[4];
    out[12 * outstride + col] = v[13];
    out[13 * outstride + col] = v[2];
    out[14 * outstride + col] = v[15];
    out[15 * outstride + col] = v[0];
  }
}